

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O2

int secp256k1_rangeproof_getheader_impl
              (size_t *offset,int *exp,int *mantissa,uint64_t *scale,uint64_t *min_value,
              uint64_t *max_value,uchar *proof,size_t plen)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar4 = 0;
  if (0x40 < plen) {
    sVar3 = *offset;
    bVar1 = proof[sVar3];
    if (-1 < (char)bVar1) {
      *exp = -1;
      *mantissa = 0;
      uVar5 = 0;
      if (0x3f < bVar1) {
        bVar2 = proof[sVar3];
        *exp = bVar2 & 0x1f;
        *offset = sVar3 + 1;
        if (0x12 < (byte)(bVar2 & 0x1f)) {
          return 0;
        }
        bVar2 = proof[sVar3 + 1];
        *mantissa = bVar2 + 1;
        if (0x3f < bVar2) {
          return 0;
        }
        uVar5 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
      }
      *max_value = uVar5;
      *offset = *offset + 1;
      *scale = 1;
      iVar4 = 0;
      if (0 < *exp) {
        iVar4 = *exp;
      }
      while (iVar4 != 0) {
        if (0x1999999999999999 < *max_value) {
          return 0;
        }
        *max_value = *max_value * 10;
        *scale = *scale * 10;
        iVar4 = iVar4 + -1;
      }
      *min_value = 0;
      iVar4 = 0;
      if ((bVar1 & 0x20) == 0) {
        uVar5 = 0;
      }
      else {
        if (plen - *offset < 8) {
          return 0;
        }
        uVar5 = 0;
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          uVar5 = uVar5 << 8 | (ulong)proof[lVar6 + *offset];
          *min_value = uVar5;
        }
        *offset = *offset + 8;
        uVar5 = *min_value;
      }
      if (!CARRY8(uVar5,*max_value)) {
        *max_value = uVar5 + *max_value;
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_getheader_impl(size_t *offset, int *exp, int *mantissa, uint64_t *scale,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    int i;
    int has_nz_range;
    int has_min;
    if (plen < 65 || ((proof[*offset] & 128) != 0)) {
        return 0;
    }
    has_nz_range = proof[*offset] & 64;
    has_min = proof[*offset] & 32;
    *exp = -1;
    *mantissa = 0;
    if (has_nz_range) {
        *exp = proof[*offset] & 31;
        *offset += 1;
        if (*exp > 18) {
           return 0;
        }
        *mantissa = proof[*offset] + 1;
        if (*mantissa > 64) {
            return 0;
         }
        *max_value = UINT64_MAX>>(64-*mantissa);
    } else {
        *max_value = 0;
    }
    *offset += 1;
    *scale = 1;
    for (i = 0; i < *exp; i++) {
        if (*max_value > UINT64_MAX / 10) {
            return 0;
        }
        *max_value *= 10;
        *scale *= 10;
    }
    *min_value = 0;
    if (has_min) {
        if(plen - *offset < 8) {
            return 0;
        }
        /*FIXME: Compact minvalue encoding?*/
        for (i = 0; i < 8; i++) {
            *min_value = (*min_value << 8) | proof[*offset + i];
        }
        *offset += 8;
    }
    if (*max_value > UINT64_MAX - *min_value) {
        return 0;
    }
    *max_value += *min_value;
    return 1;
}